

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

BBox3fa * __thiscall
embree::SceneGraph::HairSetNode::bounds(BBox3fa *__return_storage_ptr__,HairSetNode *this)

{
  undefined1 auVar1 [16];
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *p;
  pointer pvVar2;
  BBox3fa *b;
  long lVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  
  aVar5 = _DAT_0024bc00;
  aVar4 = _DAT_0024bc10;
  for (pvVar2 = (this->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 != (this->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pvVar2 = pvVar2 + 1) {
    if (pvVar2->size_active != 0) {
      lVar3 = 0;
      do {
        auVar1 = *(undefined1 (*) [16])((long)&pvVar2->items->field_0 + lVar3);
        aVar5.m128 = (__m128)minps(aVar5.m128,auVar1);
        aVar4.m128 = (__m128)maxps(aVar4.m128,auVar1);
        lVar3 = lVar3 + 0x10;
      } while (pvVar2->size_active << 4 != lVar3);
    }
  }
  (__return_storage_ptr__->lower).field_0 = aVar5;
  (__return_storage_ptr__->upper).field_0 = aVar4;
  return __return_storage_ptr__;
}

Assistant:

virtual BBox3fa bounds() const
      {
        BBox3fa b = empty;
        for (const auto& p : positions)
          for (auto& x : p)
            b.extend(x);
        return b;
      }